

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stack.h
# Opt level: O1

void __thiscall
cplus::utils::Stack<cplus::lang::StringSet::TreeNode_**>::forEach
          (Stack<cplus::lang::StringSet::TreeNode_**> *this,
          function<void_(cplus::lang::StringSet::TreeNode_**&)> *func)

{
  StackPoint *pSVar1;
  
  pSVar1 = this->state;
  while( true ) {
    if (pSVar1 == (StackPoint *)0x0) {
      return;
    }
    if ((func->super__Function_base)._M_manager == (_Manager_type)0x0) break;
    (*func->_M_invoker)((_Any_data *)func,&pSVar1->value);
    pSVar1 = pSVar1->preview;
  }
  std::__throw_bad_function_call();
}

Assistant:

void forEach(std::function<void(T &)> func) const {
				StackPoint *state = this->state;
				while (state != nullptr) {
					func(state->get());
					state = state->prev();
				}
			}